

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# botp.c
# Opt level: O0

err_t botpHOTPRand(char *otp,size_t digit,octet *key,size_t key_len,octet *ctr)

{
  bool_t bVar1;
  octet *ctr_00;
  size_t in_RCX;
  octet *in_RDX;
  void *in_RSI;
  char *in_RDI;
  void *in_R8;
  void *state;
  size_t in_stack_ffffffffffffffc8;
  err_t local_4;
  
  if ((in_RSI < (void *)0x6) || ((void *)0x8 < in_RSI)) {
    local_4 = 0x1f6;
  }
  else {
    bVar1 = memIsValid(in_RDI,(long)in_RSI + 1);
    if (((bVar1 != 0) && (bVar1 = memIsValid(in_RDX,in_RCX), bVar1 != 0)) &&
       (bVar1 = memIsValid(in_R8,8), bVar1 != 0)) {
      botpHOTP_keep();
      ctr_00 = (octet *)blobCreate(in_stack_ffffffffffffffc8);
      if (ctr_00 == (octet *)0x0) {
        return 0x6e;
      }
      botpHOTPStart(in_RDI,(size_t)in_RSI,in_RDX,in_RCX);
      botpHOTPStepS(in_R8,ctr_00);
      botpHOTPStepR(in_RDI,in_RSI);
      blobClose((blob_t)0x16b4e3);
      return 0;
    }
    local_4 = 0x6d;
  }
  return local_4;
}

Assistant:

err_t botpHOTPRand(char* otp, size_t digit, const octet key[], size_t key_len, 
	const octet ctr[8])
{
	void* state;
	// проверить входные данные
	if (digit < 6 || digit > 8)
		return ERR_BAD_PARAMS;
	if (!memIsValid(otp, digit + 1) || 
		!memIsValid(key, key_len) ||
		!memIsValid(ctr, 8))
		return ERR_BAD_INPUT;
	// создать состояние
	state = blobCreate(botpHOTP_keep());
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// сгенерировать пароль и изменить счетчик
	botpHOTPStart(state, digit, key, key_len);
	botpHOTPStepS(state, ctr);
	botpHOTPStepR(otp, state);
	// завершить
	blobClose(state);
	return ERR_OK;
}